

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O0

int compare_header_names(char *a,char *b)

{
  char *pcVar1;
  char *pcVar2;
  size_t local_68;
  ulong local_60;
  ulong local_58;
  int cmp;
  size_t min_len;
  size_t len_b;
  size_t len_a;
  char *colon_b;
  char *colon_a;
  char *b_local;
  char *a_local;
  
  pcVar1 = strchr(a,0x3a);
  pcVar2 = strchr(b,0x3a);
  if (pcVar1 == (char *)0x0) {
    local_58 = strlen(a);
  }
  else {
    local_58 = (long)pcVar1 - (long)a;
  }
  if (pcVar2 == (char *)0x0) {
    local_60 = strlen(b);
  }
  else {
    local_60 = (long)pcVar2 - (long)b;
  }
  if (local_58 < local_60) {
    local_68 = local_58;
  }
  else {
    local_68 = local_60;
  }
  a_local._4_4_ = strncmp(a,b,local_68);
  if (a_local._4_4_ == 0) {
    a_local._4_4_ = (int)local_58 - (int)local_60;
  }
  return a_local._4_4_;
}

Assistant:

static int compare_header_names(const char *a, const char *b)
{
  const char *colon_a;
  const char *colon_b;
  size_t len_a;
  size_t len_b;
  size_t min_len;
  int cmp;

  colon_a = strchr(a, ':');
  colon_b = strchr(b, ':');

  DEBUGASSERT(colon_a);
  DEBUGASSERT(colon_b);

  len_a = colon_a ? (size_t)(colon_a - a) : strlen(a);
  len_b = colon_b ? (size_t)(colon_b - b) : strlen(b);

  min_len = (len_a < len_b) ? len_a : len_b;

  cmp = strncmp(a, b, min_len);

  /* return the shorter of the two if one is shorter */
  if(!cmp)
    return (int)(len_a - len_b);

  return cmp;
}